

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O0

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,unsigned_char>
          (uchar v1,uchar v2,Nonnull<const_char_*> exprtext)

{
  ostream *poVar1;
  Nonnull<const_char_*> pcVar2;
  undefined1 local_190 [8];
  CheckOpMessageBuilder comb;
  Nonnull<const_char_*> exprtext_local;
  uchar v2_local;
  uchar v1_local;
  
  comb._368_8_ = exprtext;
  CheckOpMessageBuilder::CheckOpMessageBuilder((CheckOpMessageBuilder *)local_190,exprtext);
  poVar1 = CheckOpMessageBuilder::ForVar1((CheckOpMessageBuilder *)local_190);
  MakeCheckOpValueString(poVar1,v1);
  poVar1 = CheckOpMessageBuilder::ForVar2((CheckOpMessageBuilder *)local_190);
  MakeCheckOpValueString(poVar1,v2);
  pcVar2 = CheckOpMessageBuilder::NewString((CheckOpMessageBuilder *)local_190);
  CheckOpMessageBuilder::~CheckOpMessageBuilder((CheckOpMessageBuilder *)local_190);
  return pcVar2;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}